

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O1

int acmod_process_raw(acmod_t *acmod,int16 **inout_raw,size_t *inout_n_samps,int full_utt)

{
  int iVar1;
  int iVar2;
  mfcc_t **ppmVar3;
  ulong uVar4;
  long lVar5;
  int16 *__ptr;
  int32 nfr;
  int32 ncep;
  int32 ntail;
  int local_44;
  mfcc_t **local_40;
  int local_34;
  
  if (full_utt == 0) {
    if ((inout_n_samps != (size_t *)0x0) && (*inout_n_samps != 0)) {
      __ptr = *inout_raw;
      local_40 = (mfcc_t **)CONCAT44(local_40._4_4_,acmod->n_mfc_alloc - acmod->n_mfc_frame);
      uVar4 = (long)(acmod->n_mfc_frame + acmod->mfc_outidx) % (long)acmod->n_mfc_alloc & 0xffffffff
      ;
      do {
        iVar2 = (int)uVar4;
        if ((int)local_40 + iVar2 <= acmod->n_mfc_alloc) {
          iVar2 = fe_process_frames(acmod->fe,inout_raw,inout_n_samps,acmod->mfc_buf + iVar2,
                                    (int32 *)&local_40);
          if (iVar2 < 0) {
            return -1;
          }
          if ((FILE *)acmod->rawfh != (FILE *)0x0) {
            fwrite(__ptr,2,(long)*inout_raw - (long)__ptr >> 1,(FILE *)acmod->rawfh);
          }
          acmod->n_mfc_frame = acmod->n_mfc_frame + (int)local_40;
          goto LAB_0011b4ca;
        }
        local_44 = acmod->n_mfc_alloc - iVar2;
        iVar1 = fe_process_frames(acmod->fe,inout_raw,inout_n_samps,acmod->mfc_buf + iVar2,&local_44
                                 );
        if (iVar1 < 0) {
          iVar1 = 1;
        }
        else {
          if ((FILE *)acmod->rawfh != (FILE *)0x0) {
            fwrite(__ptr,2,(long)*inout_raw - (long)__ptr >> 1,(FILE *)acmod->rawfh);
            __ptr = *inout_raw;
          }
          acmod->n_mfc_frame = acmod->n_mfc_frame + local_44;
          local_40 = (mfcc_t **)CONCAT44(local_40._4_4_,(int)local_40 - local_44);
          iVar1 = (uint)(local_44 == 0) << 2;
          uVar4 = (long)(iVar2 + local_44) % (long)acmod->n_mfc_alloc & 0xffffffff;
        }
      } while (iVar1 == 0);
      if (iVar1 != 4) {
        return -1;
      }
    }
LAB_0011b4ca:
    iVar2 = acmod_process_mfcbuf(acmod);
  }
  else {
    if ((FILE *)acmod->rawfh != (FILE *)0x0) {
      fwrite(*inout_raw,2,*inout_n_samps,(FILE *)acmod->rawfh);
    }
    iVar1 = fe_process_frames(acmod->fe,(int16 **)0x0,inout_n_samps,(mfcc_t **)0x0,&local_44);
    iVar2 = -1;
    if (-1 < iVar1) {
      if (acmod->n_mfc_alloc <= local_44) {
        ckd_free_2d(acmod->mfc_buf);
        lVar5 = (long)local_44;
        iVar1 = fe_get_output_size(acmod->fe);
        ppmVar3 = (mfcc_t **)
                  __ckd_calloc_2d__(lVar5 + 1,(long)iVar1,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                                    ,0x223);
        acmod->mfc_buf = ppmVar3;
        acmod->n_mfc_alloc = local_44 + 1;
      }
      acmod->n_mfc_frame = 0;
      acmod->mfc_outidx = 0;
      fe_start_utt(acmod->fe);
      iVar1 = fe_process_frames(acmod->fe,inout_raw,inout_n_samps,acmod->mfc_buf,&local_44);
      if (-1 < iVar1) {
        fe_end_utt(acmod->fe,acmod->mfc_buf[local_44],&local_34);
        local_44 = local_44 + local_34;
        local_40 = acmod->mfc_buf;
        iVar2 = acmod_process_full_cep(acmod,&local_40,&local_44);
        acmod->n_mfc_frame = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int
acmod_process_raw(acmod_t *acmod,
                  int16 const **inout_raw,
                  size_t *inout_n_samps,
                  int full_utt)
{
    int32 ncep;

    /* If this is a full utterance, process it all at once. */
    if (full_utt)
        return acmod_process_full_raw(acmod, inout_raw, inout_n_samps);

    /* Append MFCCs to the end of any that are previously in there
     * (in practice, there will probably be none) */
    if (inout_n_samps && *inout_n_samps) {
        int16 const *prev_audio_inptr = *inout_raw;
        int inptr;

        /* Total number of frames available. */
        ncep = acmod->n_mfc_alloc - acmod->n_mfc_frame;
        /* Where to start writing them (circular buffer) */
        inptr = (acmod->mfc_outidx + acmod->n_mfc_frame) % acmod->n_mfc_alloc;

        /* Write them in two (or more) parts if there is wraparound. */
        while (inptr + ncep > acmod->n_mfc_alloc) {
            int32 ncep1 = acmod->n_mfc_alloc - inptr;
            if (fe_process_frames(acmod->fe, inout_raw, inout_n_samps,
                                  acmod->mfc_buf + inptr, &ncep1) < 0)
                return -1;
            /* Write to logging file if any. */
            if (acmod->rawfh) {
                fwrite(prev_audio_inptr, 2,
                       *inout_raw - prev_audio_inptr,
                       acmod->rawfh);
                prev_audio_inptr = *inout_raw;
            }
            /* ncep1 now contains the number of frames actually
             * processed.  This is a good thing, but it means we
             * actually still might have some room left at the end of
             * the buffer, hence the while loop.  Unfortunately it
             * also means that in the case where we are really
             * actually done, we need to get out totally, hence the
             * goto. */
            acmod->n_mfc_frame += ncep1;
            ncep -= ncep1;
            inptr += ncep1;
            inptr %= acmod->n_mfc_alloc;
            if (ncep1 == 0)
        	goto alldone;
        }
        assert(inptr + ncep <= acmod->n_mfc_alloc);
        if (fe_process_frames(acmod->fe, inout_raw, inout_n_samps,
                              acmod->mfc_buf + inptr, &ncep) < 0)
            return -1;
        /* Write to logging file if any. */
        if (acmod->rawfh) {
            fwrite(prev_audio_inptr, 2,
                   *inout_raw - prev_audio_inptr, acmod->rawfh);
            prev_audio_inptr = *inout_raw;
        }
        acmod->n_mfc_frame += ncep;
    alldone:
        ;
    }

    /* Hand things off to acmod_process_cep. */
    return acmod_process_mfcbuf(acmod);
}